

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O3

void FunctionalTester<int,_void>::Test(void)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  char *tmp_finish;
  uint x;
  uint uVar5;
  ulong __n;
  int iVar6;
  int iVar7;
  undefined1 auStack_119 [25];
  undefined1 *puStack_100;
  char local_f8;
  char local_f7 [7];
  buf_t buf1;
  buf_t buf2;
  undefined8 local_68;
  char *local_60;
  char *local_58;
  lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> local_50;
  TestWatcher<int> local_31 [8];
  TestWatcher<int> tw;
  
  puStack_100 = (undefined1 *)0x106907;
  TestWatcher<int>::TestWatcher(local_31);
  iVar6 = -0x80000000;
  iVar7 = 0;
  pcVar1 = (char *)((long)&local_68 + 7);
  do {
    uVar5 = iVar7 + 0x80000000;
    pcVar3 = &local_f8;
    x = uVar5;
    if ((int)uVar5 < 0) {
      local_f8 = '-';
      x = -iVar6;
      pcVar3 = local_f7;
    }
    puStack_100 = (undefined1 *)0x106949;
    pcVar3 = int2str::impl::convert_from<unsigned_char,unsigned_int,char*>(x,pcVar3);
    *pcVar3 = '\0';
    buf2._M_elems[0x28] = '\0';
    buf2._M_elems[0x29] = '\0';
    buf2._M_elems[0x2a] = '\0';
    buf2._M_elems[0x2b] = '\0';
    buf2._M_elems[0x2c] = '\0';
    buf2._M_elems[0x2d] = '\0';
    buf2._M_elems[0x2e] = '\0';
    buf2._M_elems[0x2f] = '\0';
    buf2._M_elems[0x30] = '\0';
    buf2._M_elems[0x31] = '\0';
    buf2._M_elems[0x32] = '\0';
    buf2._M_elems[0x33] = '\0';
    buf2._M_elems[0x34] = '\0';
    buf2._M_elems[0x35] = '\0';
    buf2._M_elems[0x36] = '\0';
    buf2._M_elems[0x37] = '\0';
    buf2._M_elems[0x18] = '\0';
    buf2._M_elems[0x19] = '\0';
    buf2._M_elems[0x1a] = '\0';
    buf2._M_elems[0x1b] = '\0';
    buf2._M_elems[0x1c] = '\0';
    buf2._M_elems[0x1d] = '\0';
    buf2._M_elems[0x1e] = '\0';
    buf2._M_elems[0x1f] = '\0';
    buf2._M_elems[0x20] = '\0';
    buf2._M_elems[0x21] = '\0';
    buf2._M_elems[0x22] = '\0';
    buf2._M_elems[0x23] = '\0';
    buf2._M_elems[0x24] = '\0';
    buf2._M_elems[0x25] = '\0';
    buf2._M_elems[0x26] = '\0';
    buf2._M_elems[0x27] = '\0';
    buf2._M_elems[8] = '\0';
    buf2._M_elems[9] = '\0';
    buf2._M_elems[10] = '\0';
    buf2._M_elems[0xb] = '\0';
    buf2._M_elems[0xc] = '\0';
    buf2._M_elems[0xd] = '\0';
    buf2._M_elems[0xe] = '\0';
    buf2._M_elems[0xf] = '\0';
    buf2._M_elems[0x10] = '\0';
    buf2._M_elems[0x11] = '\0';
    buf2._M_elems[0x12] = '\0';
    buf2._M_elems[0x13] = '\0';
    buf2._M_elems[0x14] = '\0';
    buf2._M_elems[0x15] = '\0';
    buf2._M_elems[0x16] = '\0';
    buf2._M_elems[0x17] = '\0';
    buf1._M_elems[0x38] = '\0';
    buf1._M_elems[0x39] = '\0';
    buf1._M_elems[0x3a] = '\0';
    buf1._M_elems[0x3b] = '\0';
    buf1._M_elems[0x3c] = '\0';
    buf1._M_elems[0x3d] = '\0';
    buf1._M_elems[0x3e] = '\0';
    buf1._M_elems[0x3f] = '\0';
    buf2._M_elems[0] = '\0';
    buf2._M_elems[1] = '\0';
    buf2._M_elems[2] = '\0';
    buf2._M_elems[3] = '\0';
    buf2._M_elems[4] = '\0';
    buf2._M_elems[5] = '\0';
    buf2._M_elems[6] = '\0';
    buf2._M_elems[7] = '\0';
    local_60 = buf2._M_elems + 0x3a;
    local_50.m_value = -uVar5;
    if (0 < (int)uVar5) {
      local_50.m_value = uVar5;
    }
    local_50.m_czero = '0';
    local_50.m_zero = 0x30;
    puStack_100 = (undefined1 *)0x106998;
    local_58 = pcVar1;
    local_50.m_finish = pcVar1;
    local_60 = boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
               convert(&local_50);
    if ((int)uVar5 < 0) {
      local_60[-1] = '-';
      local_60 = local_60 + -1;
    }
    __n = (long)pcVar1 - (long)local_60;
    if (0x3f < __n) {
      buf2._M_elems._56_8_ = &PTR__bad_cast_0010fd30;
      local_68 = &std::array<char,64ul>::typeinfo;
      puStack_100 = &LAB_00106ac2;
      local_58 = pcVar1;
      boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)(buf2._M_elems + 0x38));
    }
    puStack_100 = (undefined1 *)0x1069ca;
    local_58 = pcVar1;
    memcpy(buf1._M_elems + 0x38,local_60,__n);
    *(undefined1 *)((long)&buf1 + __n + 0x38) = 0;
    puStack_100 = (undefined1 *)0x1069e2;
    iVar2 = strcmp(&local_f8,buf1._M_elems + 0x38);
    if (iVar2 != 0) {
      puStack_100 = (undefined1 *)0x106a29;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"FAILED\n",7);
      puStack_100 = (undefined1 *)0x106a38;
      sVar4 = strlen(&local_f8);
      puStack_100 = (undefined1 *)0x106a4a;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,&local_f8,sVar4);
      puStack_100 = (undefined1 *)0x106a62;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," != ",4);
      puStack_100 = (undefined1 *)0x106a71;
      sVar4 = strlen(buf1._M_elems + 0x38);
      puStack_100 = (undefined1 *)0x106a83;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,buf1._M_elems + 0x38,sVar4);
      puStack_100 = (undefined1 *)0x106a8f;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      puStack_100 = (undefined1 *)0x106a99;
      exit(1);
    }
    iVar6 = iVar6 + 1;
    iVar7 = iVar7 + 1;
  } while (iVar7 != -1);
  puStack_100 = (undefined1 *)0x1069ff;
  TestWatcher<int>::~TestWatcher(local_31);
  return;
}

Assistant:

static void Test()
    {
        TestWatcher<T> const tw;
        typedef std::array<char, 64> buf_t;
        buf_t buf1;
        T const imin = std::numeric_limits<T>::min();
        T const imax = std::numeric_limits<T>::max();
        for (T i = imin; i < imax; ++i)
        {
            int2str::convert_with_zero(i, buf1.data());
#ifdef USE_BOOST
            buf_t buf2 = boost::lexical_cast<buf_t>(i);
#else
            buf_t buf2;
            sprintf(buf2.data(), PrintfFormat<T>(), i);
#endif
            StrcmpAndExit(buf1.data(), buf2.data());
        }
    }